

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tourmng.cpp
# Opt level: O2

bool __thiscall
banksia::TourMng::pairingMatchListRecusive
          (TourMng *this,
          vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *playerVec,int round,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *pairedSet)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  reference pvVar4;
  reference pvVar5;
  const_iterator cVar6;
  byte bVar7;
  ulong __n;
  size_type __n_00;
  ulong local_180;
  string name1;
  string name0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  MatchRecord record;
  
  uVar3 = ((long)(playerVec->
                 super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(playerVec->
                super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
                _M_impl.super__Vector_impl_data._M_start) / 0x50;
  bVar1 = true;
  local_180 = 1;
  __n_00 = 0;
  do {
    if (__n_00 == uVar3) {
      return bVar1;
    }
    pvVar4 = std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::at
                       (playerVec,__n_00);
    if ((pvVar4->flag & 1) == 0) {
      std::__cxx11::string::string((string *)&name0,(string *)&pvVar4->name);
      *(byte *)&pvVar4->flag = (byte)pvVar4->flag | 1;
      for (__n = local_180; __n < uVar3; __n = __n + 1) {
        pvVar5 = std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::at
                           (playerVec,__n);
        if ((pvVar5->flag & 1) == 0) {
          std::__cxx11::string::string((string *)&name1,(string *)&pvVar5->name);
          std::operator+(&local_110,&name0,"*");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &record,&local_110,&name1);
          cVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&pairedSet->_M_t,(key_type *)&record);
          std::__cxx11::string::~string((string *)&record);
          std::__cxx11::string::~string((string *)&local_110);
          if ((_Rb_tree_header *)cVar6._M_node == &(pairedSet->_M_t)._M_impl.super__Rb_tree_header)
          {
            *(byte *)&pvVar5->flag = (byte)pvVar5->flag | 1;
            bVar1 = pairingMatchListRecusive(this,playerVec,round,pairedSet);
            if (bVar1) {
              iVar2 = rand();
              bVar7 = pvVar5->whiteCnt < pvVar4->whiteCnt;
              if (this->type != swiss) {
                bVar7 = (byte)iVar2;
              }
              MatchRecord::MatchRecord(&record,&name0,&name1,(bool)(bVar7 & this->swapPairSides));
              record.round = round;
              addMatchRecord(this,&record);
              MatchRecord::~MatchRecord(&record);
              std::__cxx11::string::~string((string *)&name1);
              std::__cxx11::string::~string((string *)&name0);
              return true;
            }
            *(byte *)&pvVar5->flag = (byte)pvVar5->flag & 0xfe;
          }
          std::__cxx11::string::~string((string *)&name1);
        }
      }
      *(byte *)&pvVar4->flag = (byte)pvVar4->flag & 0xfe;
      std::__cxx11::string::~string((string *)&name0);
      bVar1 = false;
    }
    __n_00 = __n_00 + 1;
    local_180 = local_180 + 1;
  } while( true );
}

Assistant:

bool TourMng::pairingMatchListRecusive(std::vector<TourPlayer>& playerVec, int round, const std::set<std::string>& pairedSet)
{
    auto n = playerVec.size(); assert((n & 1) == 0); // must be even
    
    auto r = true;
    for(int i = 0; i < n; ++i) {
        auto& player0 = playerVec.at(i);
        if (player0.flag & 1) continue;
        r = false;
        auto name0 = player0.name;
        player0.flag |= 1;
        
        for(int j = i + 1; j < n; ++j) {
            auto& player1 = playerVec.at(j);
            if (player1.flag & 1) continue;
            auto name1 = player1.name;
            
            if (pairedSet.find(name0 + "*" + name1) != pairedSet.end()) {
                continue;
            }
            
            player1.flag |= 1;
            
            if (!pairingMatchListRecusive(playerVec, round, pairedSet)) {
                player1.flag &= ~1;
                continue;
            }
            
            // random swap to avoid name0 player plays all white side
            auto swap = rand() & 1;
            
            if (type == TourType::swiss) {
                swap = player0.whiteCnt > player1.whiteCnt;
            }
            MatchRecord record(name0, name1, swapPairSides && swap);
            record.round = round;
            addMatchRecord(record);
            return true;
        }
        player0.flag &= ~1;
        
    }
    return r;
}